

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O2

void __thiscall JAMA::Eigenvalue<double>::hqr2(Eigenvalue<double> *this)

{
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  long lVar8;
  int i;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  double **ppdVar13;
  int i_1;
  int i_3;
  ulong uVar14;
  uint uVar15;
  int j;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  double **ppdVar24;
  int k;
  uint uVar25;
  int j_1;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  double dVar39;
  double yr;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double local_148;
  double local_c8;
  double local_b8;
  
  uVar29 = this->n;
  uVar10 = 0;
  uVar28 = 0;
  if (0 < (int)uVar29) {
    uVar28 = (ulong)uVar29;
  }
  dVar49 = 0.0;
  for (; uVar10 != uVar28; uVar10 = uVar10 + 1) {
    iVar23 = 1;
    if (1 < (int)uVar10) {
      iVar23 = (int)uVar10;
    }
    for (uVar16 = (ulong)(iVar23 - 1); (long)uVar16 < (long)(int)uVar29; uVar16 = uVar16 + 1) {
      dVar49 = dVar49 + ABS((this->H).data_[uVar10][uVar16]);
    }
  }
  uVar9 = uVar29 - 1;
  auVar43 = ZEXT816(0);
  dVar38 = 0.0;
  auVar52._8_8_ = 0.0;
  auVar48 = ZEXT816(0);
  local_148 = 0.0;
  uVar10 = (ulong)uVar9;
LAB_0011cd2b:
  do {
    uVar27 = (uint)uVar10;
    uVar26 = uVar27 - 1;
    uVar16 = (ulong)uVar26;
    iVar23 = 0;
LAB_0011cd50:
    dVar31 = auVar43._8_8_;
    if ((int)uVar27 < 0) {
      if ((dVar49 != 0.0) || (NAN(dVar49))) {
        uVar29 = uVar29 - 2;
        for (uVar27 = uVar9; uVar26 = uVar9, -1 < (int)uVar27; uVar27 = uVar27 - 1) {
          uVar10 = (ulong)uVar27;
          pdVar2 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar50 = pdVar2[uVar10];
          dVar41 = pdVar3[uVar10];
          if ((dVar41 != 0.0) || (NAN(dVar41))) {
            if (dVar41 < 0.0) {
              uVar16 = (ulong)(uVar27 - 1);
              ppdVar13 = (this->H).data_;
              pdVar1 = ppdVar13[uVar10];
              pdVar12 = ppdVar13[uVar16];
              if (ABS(pdVar1[uVar16]) <= ABS(pdVar12[uVar10])) {
                cdiv(this,0.0,-pdVar12[uVar10],pdVar12[uVar16] - dVar50,dVar41);
                pdVar12 = (this->H).data_[uVar16];
                pdVar12[uVar16] = this->cdivr;
                dVar39 = this->cdivi;
              }
              else {
                pdVar12[uVar16] = dVar41 / pdVar1[uVar16];
                dVar39 = -(pdVar1[uVar10] - dVar50) / pdVar1[uVar16];
              }
              pdVar12[uVar10] = dVar39;
              pdVar1 = (this->H).data_[uVar10];
              pdVar1[uVar16] = 0.0;
              pdVar1[uVar10] = 1.0;
              dVar39 = -dVar41;
              uVar11 = uVar16;
              for (uVar26 = uVar27 - 2; uVar30 = (ulong)uVar26, -1 < (int)uVar26;
                  uVar26 = uVar26 - 1) {
                ppdVar13 = (this->H).data_;
                pdVar1 = ppdVar13[uVar30];
                dVar44 = 0.0;
                dVar45 = 0.0;
                for (uVar19 = uVar11; (int)uVar19 <= (int)uVar27; uVar19 = (ulong)((int)uVar19 + 1))
                {
                  dVar44 = dVar44 + ppdVar13[uVar19][uVar16] * pdVar1[uVar19];
                  dVar45 = dVar45 + ppdVar13[uVar19][uVar10] * pdVar1[uVar19];
                }
                yr = pdVar1[uVar30] - dVar50;
                dVar46 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar30];
                if (0.0 <= dVar46) {
                  if ((dVar46 != 0.0) || (NAN(dVar46))) {
                    dVar32 = pdVar1[uVar30 + 1];
                    dVar33 = ppdVar13[uVar30 + 1][uVar30];
                    dVar40 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar30] - dVar50;
                    dVar46 = dVar39 * dVar41 + dVar40 * dVar40 + dVar46 * dVar46;
                    dVar40 = (dVar40 + dVar40) * dVar41;
                    if ((dVar46 != 0.0) || (((NAN(dVar46) || (dVar40 != 0.0)) || (NAN(dVar40))))) {
                      local_b8 = ABS(dVar32);
                      local_c8 = ABS(auVar52._8_8_);
                    }
                    else {
                      local_b8 = ABS(dVar32);
                      local_c8 = ABS(auVar52._8_8_);
                      dVar46 = (local_c8 + ABS(dVar33) + local_b8 + ABS(yr) + ABS(dVar41)) *
                               dVar49 * 2.220446049250313e-16;
                    }
                    cdiv(this,dVar41 * dVar45 + (dVar32 * dVar31 - dVar44 * auVar52._8_8_),
                         dVar39 * dVar44 + (dVar32 * dVar38 - dVar45 * auVar52._8_8_),dVar46,dVar40)
                    ;
                    dVar46 = this->cdivr;
                    ppdVar13 = (this->H).data_;
                    pdVar1 = ppdVar13[uVar30];
                    pdVar1[uVar16] = dVar46;
                    dVar40 = this->cdivi;
                    pdVar1[uVar10] = dVar40;
                    if (local_b8 <= local_c8 + ABS(dVar41)) {
                      dVar33 = -dVar33;
                      cdiv(this,dVar46 * dVar33 - dVar31,dVar33 * dVar40 - dVar38,auVar52._8_8_,
                           dVar41);
                      pdVar12 = (this->H).data_[uVar30 + 1];
                      pdVar12[uVar16] = this->cdivr;
                      dVar32 = this->cdivi;
                    }
                    else {
                      pdVar12 = ppdVar13[uVar30 + 1];
                      pdVar12[uVar16] = (dVar40 * dVar41 + (-yr * dVar46 - dVar44)) / dVar32;
                      dVar32 = (pdVar1[uVar16] * dVar39 + (pdVar1[uVar10] * -yr - dVar45)) / dVar32;
                    }
                  }
                  else {
                    cdiv(this,-dVar44,-dVar45,yr,dVar41);
                    pdVar12 = (this->H).data_[uVar30];
                    pdVar12[uVar16] = this->cdivr;
                    dVar32 = this->cdivi;
                  }
                  uVar11 = (ulong)uVar26;
                  pdVar12[uVar10] = dVar32;
                  ppdVar13 = (this->H).data_;
                  pdVar1 = ppdVar13[uVar30];
                  dVar44 = ABS(pdVar1[uVar16]);
                  dVar46 = ABS(pdVar1[uVar10]);
                  if (dVar46 <= dVar44) {
                    dVar46 = dVar44;
                  }
                  yr = auVar52._8_8_;
                  dVar44 = dVar31;
                  dVar45 = dVar38;
                  if (1.0 < dVar46 * 2.220446049250313e-16 * dVar46) {
                    ppdVar13 = ppdVar13 + uVar30;
                    for (uVar30 = uVar11; (int)uVar30 <= (int)uVar27;
                        uVar30 = (ulong)((int)uVar30 + 1)) {
                      pdVar1 = *ppdVar13;
                      pdVar1[uVar16] = pdVar1[uVar16] / dVar46;
                      pdVar1[uVar10] = pdVar1[uVar10] / dVar46;
                      ppdVar13 = ppdVar13 + 1;
                    }
                  }
                }
                dVar38 = dVar45;
                auVar52._8_8_ = yr;
                dVar31 = dVar44;
              }
            }
          }
          else {
            ppdVar13 = (this->H).data_;
            ppdVar13[uVar10][uVar10] = 1.0;
            uVar11 = (ulong)uVar27;
            uVar16 = uVar10;
            uVar26 = uVar29;
            while (uVar30 = (ulong)uVar26, 0 < (int)uVar16) {
              ppdVar24 = ppdVar13 + uVar30;
              uVar19 = uVar16 - 1;
              uVar14 = uVar19 & 0xffffffff;
              pdVar1 = ppdVar13[uVar14];
              dVar31 = 0.0;
              for (uVar18 = uVar11; (int)uVar18 <= (int)uVar27; uVar18 = (ulong)((int)uVar18 + 1)) {
                dVar31 = dVar31 + pdVar1[uVar18] * ppdVar13[uVar18][uVar10];
              }
              dVar39 = pdVar1[uVar14] - dVar50;
              dVar41 = pdVar3[uVar14];
              dVar44 = dVar31;
              if (0.0 <= dVar41) {
                if ((dVar41 != 0.0) || (NAN(dVar41))) {
                  dVar44 = pdVar1[uVar16];
                  pdVar12 = ppdVar13[uVar16];
                  dVar45 = pdVar12[uVar14];
                  dVar46 = pdVar2[uVar14] - dVar50;
                  dVar41 = (dVar44 * dVar38 - dVar31 * auVar52._8_8_) /
                           (dVar46 * dVar46 + dVar41 * dVar41);
                  pdVar1[uVar10] = dVar41;
                  if (ABS(dVar44) <= ABS(auVar52._8_8_)) {
                    pdVar12[uVar10] = (-dVar45 * dVar41 - dVar38) / auVar52._8_8_;
                  }
                  else {
                    pdVar12[uVar10] = (-dVar39 * dVar41 - dVar31) / dVar44;
                  }
                }
                else {
                  if ((dVar39 == 0.0) && (!NAN(dVar39))) {
                    dVar39 = dVar49 * 2.220446049250313e-16;
                  }
                  pdVar1[uVar10] = -dVar31 / dVar39;
                }
                dVar41 = ABS(pdVar1[uVar10]);
                if (1.0 < dVar41 * 2.220446049250313e-16 * dVar41) {
                  for (; (int)uVar30 <= (int)uVar27; uVar30 = (ulong)((int)uVar30 + 1)) {
                    (*ppdVar24)[uVar10] = (*ppdVar24)[uVar10] / dVar41;
                    ppdVar24 = ppdVar24 + 1;
                  }
                }
                uVar11 = uVar19 & 0xffffffff;
                dVar39 = auVar52._8_8_;
                dVar44 = dVar38;
              }
              auVar52._8_8_ = dVar39;
              uVar26 = uVar26 - 1;
              uVar16 = uVar19;
              dVar38 = dVar44;
            }
          }
          uVar29 = uVar29 - 1;
        }
        for (; -1 < (int)uVar26; uVar26 = uVar26 - 1) {
          uVar29 = uVar26;
          if ((int)uVar9 < (int)uVar26) {
            uVar29 = uVar9;
          }
          ppdVar13 = (this->V).data_;
          for (uVar10 = 0; uVar10 != uVar28; uVar10 = uVar10 + 1) {
            dVar49 = 0.0;
            for (lVar17 = 0; lVar17 <= (int)uVar29; lVar17 = lVar17 + 1) {
              dVar49 = dVar49 + (this->V).data_[uVar10][lVar17] * (this->H).data_[lVar17][uVar26];
            }
            ppdVar13[uVar10][uVar26] = dVar49;
          }
        }
      }
      return;
    }
    ppdVar13 = (this->H).data_;
    uVar11 = uVar10;
    uVar15 = uVar27 + 1;
    do {
      if ((long)uVar11 < 1) {
        uVar15 = 0;
        break;
      }
      lVar17 = uVar11 - 1;
      ppdVar24 = ppdVar13 + uVar11;
      lVar7 = uVar11 - 1;
      lVar8 = uVar11 - 1;
      pdVar1 = *ppdVar24 + uVar11;
      uVar11 = uVar11 - 1;
      dVar38 = ABS(*pdVar1) + ABS(ppdVar13[lVar17][lVar7]);
      uVar30 = -(ulong)(dVar38 == 0.0);
      dVar38 = (double)(uVar30 & (ulong)dVar49 | ~uVar30 & (ulong)dVar38);
      uVar15 = uVar15 - 1;
    } while (dVar38 * 2.220446049250313e-16 <= ABS((*ppdVar24)[lVar8]));
    if (uVar15 == uVar27) {
      dVar31 = ppdVar13[uVar10][uVar10] + local_148;
      ppdVar13[uVar10][uVar10] = dVar31;
      (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] = dVar31;
      (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] = 0.0;
      uVar10 = uVar16;
      goto LAB_0011cd2b;
    }
    pdVar1 = ppdVar13[uVar10];
    if (uVar15 != uVar26) {
      dVar50 = 0.0;
      dVar31 = 0.0;
      if ((int)uVar15 < (int)uVar27) {
        dVar31 = ppdVar13[uVar16][uVar16];
        dVar50 = pdVar1[uVar16] * ppdVar13[uVar16][uVar10];
      }
      dVar41 = pdVar1[uVar10];
      if (iVar23 == 10) {
        for (uVar11 = 0; uVar11 <= uVar10; uVar11 = uVar11 + 1) {
          ppdVar13[uVar11][uVar11] = ppdVar13[uVar11][uVar11] - dVar41;
        }
        local_148 = local_148 + dVar41;
        dVar38 = ABS(ppdVar13[uVar16][uVar27 - 2]) + ABS(pdVar1[uVar16]);
        dVar41 = dVar38 * 0.75;
        dVar50 = dVar38 * -0.4375 * dVar38;
        dVar31 = dVar41;
      }
      if (iVar23 == 0x1e) {
        dVar39 = (dVar31 - dVar41) * 0.5;
        dVar38 = dVar39 * dVar39 + dVar50;
        if (0.0 < dVar38) {
          if (dVar38 < 0.0) {
            dVar38 = sqrt(dVar38);
          }
          else {
            dVar38 = SQRT(dVar38);
          }
          dVar38 = dVar41 - dVar50 / (dVar39 + (double)(~-(ulong)(dVar31 < dVar41) & (ulong)dVar38 |
                                                       (ulong)-dVar38 & -(ulong)(dVar31 < dVar41)));
          ppdVar13 = (this->H).data_;
          for (uVar11 = 0; uVar11 <= uVar10; uVar11 = uVar11 + 1) {
            pdVar1 = ppdVar13[uVar11];
            pdVar1[uVar11] = pdVar1[uVar11] - dVar38;
          }
          local_148 = local_148 + dVar38;
          dVar50 = 0.964;
          dVar41 = 0.964;
          dVar31 = 0.964;
        }
      }
      iVar23 = iVar23 + 1;
      ppdVar13 = (this->H).data_;
      uVar11 = (ulong)(uVar27 - 2);
      uVar20 = uVar27;
      do {
        uVar22 = uVar20 - 2;
        uVar30 = uVar11;
        if ((int)uVar22 < (int)uVar15) break;
        pdVar1 = ppdVar13[uVar22];
        auVar52._8_8_ = pdVar1[uVar22];
        uVar25 = uVar20 - 1;
        dVar39 = ppdVar13[uVar25][uVar25];
        dVar44 = ((dVar41 - auVar52._8_8_) * (dVar31 - auVar52._8_8_) + -dVar50) /
                 ppdVar13[uVar25][uVar22] + pdVar1[uVar25];
        auVar42._0_8_ =
             ((dVar39 - auVar52._8_8_) - (dVar41 - auVar52._8_8_)) - (dVar31 - auVar52._8_8_);
        auVar42._8_8_ = ppdVar13[uVar20][uVar25];
        dVar38 = ABS(ppdVar13[uVar20][uVar25]) + ABS(auVar42._0_8_) + ABS(dVar44);
        auVar48._0_8_ = dVar44 / dVar38;
        auVar48._8_8_ = 0;
        auVar34._8_8_ = dVar38;
        auVar34._0_8_ = dVar38;
        auVar43 = divpd(auVar42,auVar34);
        if ((-2 - uVar15) + uVar20 == 0) {
          uVar30 = (ulong)uVar15;
          break;
        }
        uVar11 = (ulong)((int)uVar11 - 1);
        uVar21 = uVar20 - 3;
        uVar30 = (ulong)uVar22;
        uVar20 = uVar25;
      } while ((ABS(auVar52._8_8_) + ABS(ppdVar13[uVar21][uVar21]) + ABS(dVar39)) *
               ABS(auVar48._0_8_) * 2.220446049250313e-16 <=
               (ABS(auVar43._8_8_) + ABS(auVar43._0_8_)) * ABS(pdVar1[uVar21]));
      uVar20 = (uint)uVar30;
      uVar11 = uVar30;
      while( true ) {
        iVar6 = (int)uVar11;
        uVar22 = iVar6 + 2;
        if ((int)uVar27 < (int)uVar22) break;
        pdVar1 = ppdVar13[uVar22];
        pdVar1[uVar11] = 0.0;
        if ((int)(uVar20 + 2) < (int)uVar22) {
          pdVar1[iVar6 - 1] = 0.0;
        }
        uVar11 = (ulong)(iVar6 + 1);
      }
      ppdVar13 = (this->H).data_;
      auVar52._0_8_ = dVar41;
      uVar11 = uVar30;
      while( true ) {
        uVar19 = uVar11;
        uVar22 = (uint)uVar19;
        if ((int)uVar27 <= (int)uVar22) break;
        if (uVar22 == uVar20) {
          dVar31 = auVar52._0_8_;
        }
        else {
          uVar25 = uVar22 - 1;
          dVar31 = 0.0;
          if (uVar22 != uVar26) {
            dVar31 = ppdVar13[uVar22 + 2][uVar25];
          }
          dVar50 = ppdVar13[uVar19][uVar25];
          auVar48._8_8_ = 0;
          auVar48._0_8_ = dVar50;
          auVar43._8_8_ = dVar31;
          auVar43._0_8_ = ppdVar13[uVar22 + 1][uVar25];
          dVar31 = ABS(dVar31) + ABS(ppdVar13[uVar22 + 1][uVar25]) + ABS(dVar50);
          if ((dVar31 != 0.0) || (NAN(dVar31))) {
            auVar48._0_8_ = dVar50 / dVar31;
            auVar48._8_8_ = 0;
            auVar35._8_8_ = dVar31;
            auVar35._0_8_ = dVar31;
            auVar43 = divpd(auVar43,auVar35);
          }
        }
        if ((dVar31 == 0.0) && (!NAN(dVar31))) break;
        dVar50 = auVar43._0_8_;
        dVar44 = auVar43._8_8_;
        dVar45 = auVar48._0_8_;
        dVar41 = SQRT(dVar44 * dVar44 + dVar45 * dVar45 + dVar50 * dVar50);
        dVar39 = -dVar41;
        dVar38 = (double)(-(ulong)(dVar45 < 0.0) & (ulong)dVar39 |
                         ~-(ulong)(dVar45 < 0.0) & (ulong)dVar41);
        if ((dVar41 != dVar39) || (NAN(dVar41) || NAN(dVar39))) {
          if (uVar22 == uVar20) {
            if (uVar15 != uVar20) {
              ppdVar13[uVar30][uVar20 - 1] = -ppdVar13[uVar30][uVar20 - 1];
            }
          }
          else {
            ppdVar13[uVar19][uVar22 - 1] = dVar31 * -dVar38;
          }
          auVar48._0_8_ = dVar45 + dVar38;
          dVar50 = dVar50 / dVar38;
          auVar51._8_8_ = dVar44;
          auVar51._0_8_ = auVar48._0_8_;
          auVar36._8_8_ = dVar38;
          auVar36._0_8_ = dVar38;
          auVar52 = divpd(auVar51,auVar36);
          auVar37._8_8_ = auVar48._0_8_;
          auVar37._0_8_ = auVar48._0_8_;
          auVar43 = divpd(auVar43,auVar37);
          ppdVar24 = (this->H).data_;
          uVar11 = (ulong)(uVar22 + 1);
          uVar25 = uVar22 + 2;
          dVar31 = auVar43._0_8_;
          dVar41 = auVar43._8_8_;
          uVar18 = uVar19;
          while( true ) {
            dVar39 = auVar52._0_8_;
            if ((int)uVar29 <= (int)uVar18) break;
            pdVar1 = ppdVar24[uVar19];
            dVar44 = pdVar1[uVar18];
            pdVar12 = ppdVar24[uVar11];
            dVar45 = pdVar12[uVar18] * dVar31 + dVar44;
            if (uVar22 != uVar26) {
              dVar44 = ppdVar24[uVar25][uVar18];
              dVar45 = dVar45 + dVar41 * dVar44;
              ppdVar24[uVar25][uVar18] = dVar44 - dVar45 * auVar52._8_8_;
              dVar44 = pdVar1[uVar18];
            }
            auVar48._8_8_ = 0;
            auVar48._0_8_ = dVar45;
            pdVar1[uVar18] = -dVar45 * dVar39 + dVar44;
            pdVar12[uVar18] = -dVar45 * dVar50 + pdVar12[uVar18];
            uVar18 = (ulong)((int)uVar18 + 1);
          }
          uVar21 = uVar22 + 3;
          if ((int)uVar27 <= (int)(uVar22 + 3)) {
            uVar21 = uVar27;
          }
          ppdVar24 = (this->H).data_;
          for (lVar17 = 0; lVar17 <= (int)uVar21; lVar17 = lVar17 + 1) {
            pdVar1 = ppdVar24[lVar17];
            dVar44 = pdVar1[uVar19];
            dVar45 = pdVar1[uVar11];
            dVar46 = dVar39 * dVar44 + dVar50 * dVar45;
            if (uVar22 != uVar26) {
              dVar46 = dVar46 + auVar52._8_8_ * pdVar1[uVar25];
              pdVar1[uVar25] = pdVar1[uVar25] - dVar46 * dVar41;
            }
            auVar48._8_8_ = auVar52._8_8_;
            auVar48._0_8_ = dVar46;
            pdVar1[uVar19] = dVar44 - dVar46;
            pdVar1[uVar11] = -dVar46 * dVar31 + dVar45;
          }
          ppdVar24 = (this->V).data_;
          for (uVar18 = 0; uVar28 != uVar18; uVar18 = uVar18 + 1) {
            pdVar1 = ppdVar24[uVar18];
            dVar44 = pdVar1[uVar19];
            dVar45 = pdVar1[uVar11];
            dVar46 = dVar39 * dVar44 + dVar50 * dVar45;
            if (uVar22 != uVar26) {
              dVar46 = dVar46 + auVar52._8_8_ * pdVar1[uVar25];
              pdVar1[uVar25] = pdVar1[uVar25] - dVar46 * dVar41;
            }
            auVar48._8_8_ = auVar52._8_8_;
            auVar48._0_8_ = dVar46;
            pdVar1[uVar19] = dVar44 - dVar46;
            pdVar1[uVar11] = -dVar46 * dVar31 + dVar45;
          }
        }
        else {
          auVar52._0_8_ = dVar31;
          uVar11 = (ulong)(uVar22 + 1);
        }
      }
      goto LAB_0011cd50;
    }
    dVar50 = pdVar1[uVar15];
    pdVar12 = ppdVar13[uVar15];
    dVar41 = pdVar12[uVar10];
    auVar48._0_8_ = (pdVar12[uVar15] - pdVar1[uVar10]) * 0.5;
    dVar44 = auVar48._0_8_ * auVar48._0_8_ + dVar50 * dVar41;
    auVar52._8_8_ = SQRT(ABS(dVar44));
    pdVar1[uVar10] = pdVar1[uVar10] + local_148;
    pdVar12[uVar15] = pdVar12[uVar15] + local_148;
    dVar39 = pdVar1[uVar10];
    if (0.0 <= dVar44) {
      auVar52._8_8_ =
           (double)(~-(ulong)(auVar48._0_8_ < 0.0) & (ulong)auVar52._8_8_ |
                   (ulong)-auVar52._8_8_ & -(ulong)(auVar48._0_8_ < 0.0)) + auVar48._0_8_;
      pdVar2 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[(int)uVar15] = auVar52._8_8_ + dVar39;
      pdVar2[uVar10] =
           (double)(-(ulong)(auVar52._8_8_ != 0.0) &
                    (ulong)(dVar39 - (dVar50 * dVar41) / auVar52._8_8_) |
                   ~-(ulong)(auVar52._8_8_ != 0.0) & (ulong)(auVar52._8_8_ + dVar39));
      pdVar2 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[(int)uVar15] = 0.0;
      pdVar2[uVar10] = 0.0;
      auVar47._8_8_ = auVar52._8_8_;
      auVar47._0_8_ = pdVar1[uVar15];
      dVar38 = ABS(auVar52._8_8_) + ABS(pdVar1[uVar15]);
      auVar4._8_8_ = dVar38;
      auVar4._0_8_ = dVar38;
      auVar43 = divpd(auVar47,auVar4);
      dVar31 = SQRT(auVar43._0_8_ * auVar43._0_8_ + auVar43._8_8_ * auVar43._8_8_);
      auVar5._8_8_ = dVar31;
      auVar5._0_8_ = dVar31;
      auVar48 = divpd(auVar43,auVar5);
      ppdVar13 = (this->H).data_;
      dVar41 = auVar48._0_8_;
      dVar39 = auVar48._8_8_;
      dVar50 = -dVar41;
      for (uVar26 = uVar15; (int)uVar26 < (int)uVar29; uVar26 = uVar26 + 1) {
        pdVar1 = ppdVar13[uVar15];
        auVar52._8_8_ = pdVar1[uVar26];
        pdVar12 = ppdVar13[uVar10];
        pdVar1[uVar26] = dVar39 * auVar52._8_8_ + pdVar12[uVar26] * dVar41;
        pdVar12[uVar26] = pdVar12[uVar26] * dVar39 + auVar52._8_8_ * dVar50;
      }
      ppdVar13 = (this->H).data_;
      for (uVar16 = 0; uVar16 <= uVar10; uVar16 = uVar16 + 1) {
        pdVar1 = ppdVar13[uVar16];
        auVar52._8_8_ = pdVar1[uVar15];
        dVar44 = pdVar1[uVar10];
        pdVar1[uVar15] = dVar39 * auVar52._8_8_ + dVar41 * dVar44;
        pdVar1[uVar10] = dVar44 * dVar39 + auVar52._8_8_ * dVar50;
      }
      ppdVar13 = (this->V).data_;
      for (uVar16 = 0; uVar28 != uVar16; uVar16 = uVar16 + 1) {
        pdVar1 = ppdVar13[uVar16];
        auVar52._8_8_ = pdVar1[uVar15];
        dVar44 = pdVar1[uVar10];
        pdVar1[uVar15] = dVar39 * auVar52._8_8_ + dVar41 * dVar44;
        pdVar1[uVar10] = dVar44 * dVar39 + auVar52._8_8_ * dVar50;
      }
    }
    else {
      pdVar2 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[(int)uVar15] = dVar39 + auVar48._0_8_;
      pdVar2[uVar10] = dVar39 + auVar48._0_8_;
      pdVar2 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[(int)uVar15] = auVar52._8_8_;
      pdVar2[uVar10] = -auVar52._8_8_;
      auVar48._8_8_ = dVar44;
    }
    auVar43._8_8_ = dVar31;
    auVar43._0_8_ = auVar48._8_8_;
    uVar10 = (ulong)(uVar27 - 2);
  } while( true );
}

Assistant:

void hqr2() {
      //  This is derived from the Algol procedure hqr2,
      //  by Martin and Wilkinson, Handbook for Auto. Comp.,
      //  Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      // Initialize

      int nn       = this->n;
      int n        = nn - 1;
      int low      = 0;
      int high     = nn - 1;
      Real eps     = pow(2.0, -52.0);
      Real exshift = 0.0;
      Real p = 0, q = 0, r = 0, s = 0, z = 0, t, w, x, y;

      // Store roots isolated by balanc and compute matrix norm

      Real norm = 0.0;
      for (int i = 0; i < nn; i++) {
        if ((i < low) || (i > high)) {
          d(i) = H(i, i);
          e(i) = 0.0;
        }
        for (int j = max(i - 1, 0); j < nn; j++) {
          norm = norm + abs(H(i, j));
        }
      }

      // Outer loop over eigenvalue index

      int iter = 0;
      while (n >= low) {
        // Look for single small sub-diagonal element

        int l = n;
        while (l > low) {
          s = abs(H(l - 1, l - 1)) + abs(H(l, l));
          if (s == 0.0) { s = norm; }
          if (abs(H(l, l - 1)) < eps * s) { break; }
          l--;
        }

        // Check for convergence
        // One root found

        if (l == n) {
          H(n, n) = H(n, n) + exshift;
          d(n)    = H(n, n);
          e(n)    = 0.0;
          n--;
          iter = 0;

          // Two roots found

        } else if (l == n - 1) {
          w               = H(n, n - 1) * H(n - 1, n);
          p               = (H(n - 1, n - 1) - H(n, n)) / 2.0;
          q               = p * p + w;
          z               = sqrt(abs(q));
          H(n, n)         = H(n, n) + exshift;
          H(n - 1, n - 1) = H(n - 1, n - 1) + exshift;
          x               = H(n, n);

          // Real pair

          if (q >= 0) {
            if (p >= 0) {
              z = p + z;
            } else {
              z = p - z;
            }
            d(n - 1) = x + z;
            d(n)     = d(n - 1);
            if (z != 0.0) { d(n) = x - w / z; }
            e(n - 1) = 0.0;
            e(n)     = 0.0;
            x        = H(n, n - 1);
            s        = abs(x) + abs(z);
            p        = x / s;
            q        = z / s;
            r        = sqrt(p * p + q * q);
            p        = p / r;
            q        = q / r;

            // Row modification

            for (int j = n - 1; j < nn; j++) {
              z           = H(n - 1, j);
              H(n - 1, j) = q * z + p * H(n, j);
              H(n, j)     = q * H(n, j) - p * z;
            }

            // Column modification

            for (int i = 0; i <= n; i++) {
              z           = H(i, n - 1);
              H(i, n - 1) = q * z + p * H(i, n);
              H(i, n)     = q * H(i, n) - p * z;
            }

            // Accumulate transformations

            for (int i = low; i <= high; i++) {
              z           = V(i, n - 1);
              V(i, n - 1) = q * z + p * V(i, n);
              V(i, n)     = q * V(i, n) - p * z;
            }

            // Complex pair

          } else {
            d(n - 1) = x + p;
            d(n)     = x + p;
            e(n - 1) = z;
            e(n)     = -z;
          }
          n    = n - 2;
          iter = 0;

          // No convergence yet

        } else {
          // Form shift

          x = H(n, n);
          y = 0.0;
          w = 0.0;
          if (l < n) {
            y = H(n - 1, n - 1);
            w = H(n, n - 1) * H(n - 1, n);
          }

          // Wilkinson's original ad hoc shift

          if (iter == 10) {
            exshift += x;
            for (int i = low; i <= n; i++) {
              H(i, i) -= x;
            }
            s = abs(H(n, n - 1)) + abs(H(n - 1, n - 2));
            x = y = 0.75 * s;
            w     = -0.4375 * s * s;
          }

          // MATLAB's new ad hoc shift

          if (iter == 30) {
            s = (y - x) / 2.0;
            s = s * s + w;
            if (s > 0) {
              s = sqrt(s);
              if (y < x) { s = -s; }
              s = x - w / ((y - x) / 2.0 + s);
              for (int i = low; i <= n; i++) {
                H(i, i) -= s;
              }
              exshift += s;
              x = y = w = 0.964;
            }
          }

          iter = iter + 1;  // (Could check iteration count here.)

          // Look for two consecutive small sub-diagonal elements

          int m = n - 2;
          while (m >= l) {
            z = H(m, m);
            r = x - z;
            s = y - z;
            p = (r * s - w) / H(m + 1, m) + H(m, m + 1);
            q = H(m + 1, m + 1) - z - r - s;
            r = H(m + 2, m + 1);
            s = abs(p) + abs(q) + abs(r);
            p = p / s;
            q = q / s;
            r = r / s;
            if (m == l) { break; }
            if (abs(H(m, m - 1)) * (abs(q) + abs(r)) <
                eps * (abs(p) * (abs(H(m - 1, m - 1)) + abs(z) +
                                 abs(H(m + 1, m + 1))))) {
              break;
            }
            m--;
          }

          for (int i = m + 2; i <= n; i++) {
            H(i, i - 2) = 0.0;
            if (i > m + 2) { H(i, i - 3) = 0.0; }
          }

          // Double QR step involving rows l:n and columns m:n

          for (int k = m; k <= n - 1; k++) {
            int notlast = (k != n - 1);
            if (k != m) {
              p = H(k, k - 1);
              q = H(k + 1, k - 1);
              r = (notlast ? H(k + 2, k - 1) : 0.0);
              x = abs(p) + abs(q) + abs(r);
              if (x != 0.0) {
                p = p / x;
                q = q / x;
                r = r / x;
              }
            }
            if (x == 0.0) { break; }
            s = sqrt(p * p + q * q + r * r);
            if (p < 0) { s = -s; }
            if (s != 0) {
              if (k != m) {
                H(k, k - 1) = -s * x;
              } else if (l != m) {
                H(k, k - 1) = -H(k, k - 1);
              }
              p = p + s;
              x = p / s;
              y = q / s;
              z = r / s;
              q = q / p;
              r = r / p;

              // Row modification

              for (int j = k; j < nn; j++) {
                p = H(k, j) + q * H(k + 1, j);
                if (notlast) {
                  p           = p + r * H(k + 2, j);
                  H(k + 2, j) = H(k + 2, j) - p * z;
                }
                H(k, j)     = H(k, j) - p * x;
                H(k + 1, j) = H(k + 1, j) - p * y;
              }

              // Column modification

              for (int i = 0; i <= min(n, k + 3); i++) {
                p = x * H(i, k) + y * H(i, k + 1);
                if (notlast) {
                  p           = p + z * H(i, k + 2);
                  H(i, k + 2) = H(i, k + 2) - p * r;
                }
                H(i, k)     = H(i, k) - p;
                H(i, k + 1) = H(i, k + 1) - p * q;
              }

              // Accumulate transformations

              for (int i = low; i <= high; i++) {
                p = x * V(i, k) + y * V(i, k + 1);
                if (notlast) {
                  p           = p + z * V(i, k + 2);
                  V(i, k + 2) = V(i, k + 2) - p * r;
                }
                V(i, k)     = V(i, k) - p;
                V(i, k + 1) = V(i, k + 1) - p * q;
              }
            }  // (s != 0)
          }    // k loop
        }      // check convergence
      }        // while (n >= low)

      // Backsubstitute to find vectors of upper triangular form

      if (norm == 0.0) { return; }

      for (n = nn - 1; n >= 0; n--) {
        p = d(n);
        q = e(n);

        // Real vector

        if (q == 0) {
          int l   = n;
          H(n, n) = 1.0;
          for (int i = n - 1; i >= 0; i--) {
            w = H(i, i) - p;
            r = 0.0;
            for (int j = l; j <= n; j++) {
              r = r + H(i, j) * H(j, n);
            }
            if (e(i) < 0.0) {
              z = w;
              s = r;
            } else {
              l = i;
              if (e(i) == 0.0) {
                if (w != 0.0) {
                  H(i, n) = -r / w;
                } else {
                  H(i, n) = -r / (eps * norm);
                }

                // Solve real equations

              } else {
                x       = H(i, i + 1);
                y       = H(i + 1, i);
                q       = (d(i) - p) * (d(i) - p) + e(i) * e(i);
                t       = (x * s - z * r) / q;
                H(i, n) = t;
                if (abs(x) > abs(z)) {
                  H(i + 1, n) = (-r - w * t) / x;
                } else {
                  H(i + 1, n) = (-s - y * t) / z;
                }
              }

              // Overflow control

              t = abs(H(i, n));
              if ((eps * t) * t > 1) {
                for (int j = i; j <= n; j++) {
                  H(j, n) = H(j, n) / t;
                }
              }
            }
          }

          // Complex vector

        } else if (q < 0) {
          int l = n - 1;

          // Last vector component imaginary so matrix is triangular

          if (abs(H(n, n - 1)) > abs(H(n - 1, n))) {
            H(n - 1, n - 1) = q / H(n, n - 1);
            H(n - 1, n)     = -(H(n, n) - p) / H(n, n - 1);
          } else {
            cdiv(0.0, -H(n - 1, n), H(n - 1, n - 1) - p, q);
            H(n - 1, n - 1) = cdivr;
            H(n - 1, n)     = cdivi;
          }
          H(n, n - 1) = 0.0;
          H(n, n)     = 1.0;
          for (int i = n - 2; i >= 0; i--) {
            Real ra, sa, vr, vi;
            ra = 0.0;
            sa = 0.0;
            for (int j = l; j <= n; j++) {
              ra = ra + H(i, j) * H(j, n - 1);
              sa = sa + H(i, j) * H(j, n);
            }
            w = H(i, i) - p;

            if (e(i) < 0.0) {
              z = w;
              r = ra;
              s = sa;
            } else {
              l = i;
              if (e(i) == 0) {
                cdiv(-ra, -sa, w, q);
                H(i, n - 1) = cdivr;
                H(i, n)     = cdivi;
              } else {
                // Solve complex equations

                x  = H(i, i + 1);
                y  = H(i + 1, i);
                vr = (d(i) - p) * (d(i) - p) + e(i) * e(i) - q * q;
                vi = (d(i) - p) * 2.0 * q;
                if ((vr == 0.0) && (vi == 0.0)) {
                  vr =
                      eps * norm * (abs(w) + abs(q) + abs(x) + abs(y) + abs(z));
                }
                cdiv(x * r - z * ra + q * sa, x * s - z * sa - q * ra, vr, vi);
                H(i, n - 1) = cdivr;
                H(i, n)     = cdivi;
                if (abs(x) > (abs(z) + abs(q))) {
                  H(i + 1, n - 1) = (-ra - w * H(i, n - 1) + q * H(i, n)) / x;
                  H(i + 1, n)     = (-sa - w * H(i, n) - q * H(i, n - 1)) / x;
                } else {
                  cdiv(-r - y * H(i, n - 1), -s - y * H(i, n), z, q);
                  H(i + 1, n - 1) = cdivr;
                  H(i + 1, n)     = cdivi;
                }
              }

              // Overflow control

              t = max(abs(H(i, n - 1)), abs(H(i, n)));
              if ((eps * t) * t > 1) {
                for (int j = i; j <= n; j++) {
                  H(j, n - 1) = H(j, n - 1) / t;
                  H(j, n)     = H(j, n) / t;
                }
              }
            }
          }
        }
      }

      // Vectors of isolated roots

      for (int i = 0; i < nn; i++) {
        if (i < low || i > high) {
          for (int j = i; j < nn; j++) {
            V(i, j) = H(i, j);
          }
        }
      }

      // Back transformation to get eigenvectors of original matrix

      for (int j = nn - 1; j >= low; j--) {
        for (int i = low; i <= high; i++) {
          z = 0.0;
          for (int k = low; k <= min(j, high); k++) {
            z = z + V(i, k) * H(k, j);
          }
          V(i, j) = z;
        }
      }
    }